

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

HelicsFederate helicsAppGetFederate(HelicsApp app,HelicsError *err)

{
  App *pAVar1;
  HelicsFederate pvVar2;
  __shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<helics::Federate> local_30;
  
  pAVar1 = getApp(app,err);
  if (pAVar1 == (App *)0x0) {
    pvVar2 = (HelicsFederate)0x0;
  }
  else {
    std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)&pAVar1->fed
              );
    if (local_40._M_ptr == (element_type *)0x0) {
      local_30.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_30.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)&((local_40._M_ptr)->super_ValueFederate)._vptr_ValueFederate +
           (long)((local_40._M_ptr)->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    local_30.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_40._M_refcount._M_pi;
    local_40._M_ptr = (element_type *)0x0;
    local_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar2 = generateNewHelicsFederateObject(&local_30,COMBINATION);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return pvVar2;
}

Assistant:

HelicsFederate helicsAppGetFederate(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return nullptr;
    }
    try {
        return generateNewHelicsFederateObject(happ->getUnderlyingFederatePointer(), helics::FederateType::COMBINATION);
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}